

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.cpp
# Opt level: O2

void zmq::assert_success_or_recoverable(fd_t s_,int rc_)

{
  int iVar1;
  int *piVar2;
  char *errmsg_;
  int err;
  socklen_t len;
  
  if (rc_ == -1) {
    err = 0;
    len = 4;
    iVar1 = getsockopt(s_,1,4,&err,&len);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      err = *piVar2;
    }
    iVar1 = err;
    if (err != 0) {
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      if ((((0xd < iVar1 - 100U) || ((0x2c1fU >> (iVar1 - 100U & 0x1f) & 1) == 0)) && (iVar1 != 4))
         && (iVar1 != 0x16)) {
        errmsg_ = strerror(iVar1);
        fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip.cpp"
                ,0x361);
        fflush(_stderr);
        zmq_abort(errmsg_);
      }
    }
    return;
  }
  return;
}

Assistant:

void zmq::assert_success_or_recoverable (zmq::fd_t s_, int rc_)
{
#ifdef ZMQ_HAVE_WINDOWS
    if (rc_ != SOCKET_ERROR) {
        return;
    }
#else
    if (rc_ != -1) {
        return;
    }
#endif

    //  Check whether an error occurred
    int err = 0;
#if defined ZMQ_HAVE_HPUX || defined ZMQ_HAVE_VXWORKS
    int len = sizeof err;
#else
    socklen_t len = sizeof err;
#endif

    const int rc = getsockopt (s_, SOL_SOCKET, SO_ERROR,
                               reinterpret_cast<char *> (&err), &len);

    //  Assert if the error was caused by 0MQ bug.
    //  Networking problems are OK. No need to assert.
#ifdef ZMQ_HAVE_WINDOWS
    zmq_assert (rc == 0);
    if (err != 0) {
        wsa_assert (err == WSAECONNREFUSED || err == WSAECONNRESET
                    || err == WSAECONNABORTED || err == WSAEINTR
                    || err == WSAETIMEDOUT || err == WSAEHOSTUNREACH
                    || err == WSAENETUNREACH || err == WSAENETDOWN
                    || err == WSAENETRESET || err == WSAEACCES
                    || err == WSAEINVAL || err == WSAEADDRINUSE);
    }
#else
    //  Following code should handle both Berkeley-derived socket
    //  implementations and Solaris.
    if (rc == -1)
        err = errno;
    if (err != 0) {
        errno = err;
        errno_assert (errno == ECONNREFUSED || errno == ECONNRESET
                      || errno == ECONNABORTED || errno == EINTR
                      || errno == ETIMEDOUT || errno == EHOSTUNREACH
                      || errno == ENETUNREACH || errno == ENETDOWN
                      || errno == ENETRESET || errno == EINVAL);
    }
#endif
}